

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlNewDocPI(xmlDocPtr doc,xmlChar *name,xmlChar *content)

{
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  
  if (name != (xmlChar *)0x0) {
    pxVar1 = (xmlNodePtr)(*xmlMalloc)(0x78);
    if (pxVar1 != (xmlNodePtr)0x0) {
      pxVar1->_private = (void *)0x0;
      *(undefined8 *)&pxVar1->type = 0;
      pxVar1->nsDef = (xmlNs *)0x0;
      pxVar1->psvi = (void *)0x0;
      pxVar1->content = (xmlChar *)0x0;
      pxVar1->properties = (_xmlAttr *)0x0;
      pxVar1->doc = (_xmlDoc *)0x0;
      pxVar1->ns = (xmlNs *)0x0;
      pxVar1->next = (_xmlNode *)0x0;
      pxVar1->prev = (_xmlNode *)0x0;
      pxVar1->line = 0;
      pxVar1->extra = 0;
      *(undefined4 *)&pxVar1->field_0x74 = 0;
      pxVar1->last = (_xmlNode *)0x0;
      pxVar1->parent = (_xmlNode *)0x0;
      pxVar1->name = (xmlChar *)0x0;
      pxVar1->children = (_xmlNode *)0x0;
      pxVar1->type = XML_PI_NODE;
      if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
        pxVar2 = xmlStrdup(name);
      }
      else {
        pxVar2 = xmlDictLookup(doc->dict,name,-1);
      }
      pxVar1->name = pxVar2;
      if (content != (xmlChar *)0x0) {
        pxVar2 = xmlStrdup(content);
        pxVar1->content = pxVar2;
      }
      pxVar1->doc = doc;
      if (__xmlRegisterCallbacks == 0) {
        return pxVar1;
      }
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      if (*pp_Var3 == (xmlRegisterNodeFunc)0x0) {
        return pxVar1;
      }
      pp_Var3 = __xmlRegisterNodeDefaultValue();
      (**pp_Var3)(pxVar1);
      return pxVar1;
    }
    xmlTreeErrMemory("building PI");
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlNewDocPI(xmlDocPtr doc, const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewPI : name == NULL\n");
#endif
	return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL) {
	xmlTreeErrMemory("building PI");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_PI_NODE;

    if ((doc != NULL) && (doc->dict != NULL))
        cur->name = xmlDictLookup(doc->dict, name, -1);
    else
	cur->name = xmlStrdup(name);
    if (content != NULL) {
	cur->content = xmlStrdup(content);
    }
    cur->doc = doc;

    if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)cur);
    return(cur);
}